

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
google::protobuf::FatalException::FatalException
          (FatalException *this,char *filename,int line,string *message)

{
  string *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__FatalException_00955f78;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined4 *)(in_RDI + 0x10) = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 0x18),in_RCX);
  return;
}

Assistant:

FatalException(const char* filename, int line, const std::string& message)
      : filename_(filename), line_(line), message_(message) {}